

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::ExternalFrameBufferTest_NullRealloc_Test>
::CreateTest(TestFactoryImpl<(anonymous_namespace)::ExternalFrameBufferTest_NullRealloc_Test> *this)

{
  ExternalFrameBufferTest *this_00;
  
  this_00 = (ExternalFrameBufferTest *)operator_new(0x40);
  anon_unknown.dwarf_d00580::ExternalFrameBufferTest::ExternalFrameBufferTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ExternalFrameBufferTest_00f16608;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }